

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
test::prod_test::iu_PeepClassTest_x_iutest_x_StaticPeep_Test::
iu_PeepClassTest_x_iutest_x_StaticPeep_Test(iu_PeepClassTest_x_iutest_x_StaticPeep_Test *this)

{
  iu_PeepClassTest_x_iutest_x_StaticPeep_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_PeepClassTest_x_iutest_x_StaticPeep_Test_00623970;
  return;
}

Assistant:

IUTEST(PeepClassTest, StaticPeep)
{
    // object 版
    IUTEST_PEEP(ProdClass, m_y) prod_class_y;
    prod_class_y = 5;
    IUTEST_EXPECT_EQ(5, ProdClass::GetY());
    prod_class_y *= 2;
    IUTEST_EXPECT_EQ(10, ProdClass::GetY());

    IUTEST_PEEP(ProdClass, m_y)(1);
    IUTEST_EXPECT_EQ(1, prod_class_y);

    IUTEST_PEEP(ProdClass, m_y) prod_class_y2 = 2;
    IUTEST_EXPECT_EQ(2, prod_class_y2);
}